

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void saucy_search(Abc_Ntk_t *pNtk,saucy *s,int directed,int *colors,saucy_stats *stats)

{
  coloring *c;
  coloring *c_00;
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint n;
  Vec_Int_t **ppVVar4;
  int *piVar5;
  saucy_stats *psVar6;
  int i;
  int iVar7;
  Abc_Ntk_t *pAVar8;
  int *piVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  sim_result *psVar13;
  uint uVar14;
  int iVar15;
  code *pcVar16;
  ulong uVar17;
  code *pcVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  code *pcVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int i_1;
  long lVar26;
  long lVar27;
  saucy *s_00;
  Vec_Ptr_t *p;
  long lVar28;
  long lVar29;
  bool bVar30;
  double dVar31;
  undefined1 auVar32 [12];
  int rmin;
  sim_result *local_68;
  int *local_60;
  saucy *local_58;
  Vec_Int_t **local_50;
  int lmin;
  int target;
  saucy_stats *local_40;
  long local_38;
  
  s->pNtk = pNtk;
  pAVar8 = Abc_NtkDup(pNtk);
  s->pNtk_permuted = pAVar8;
  local_50 = s->iDep;
  ppVVar4 = s->oDep;
  uVar14 = pNtk->vPos->nSize;
  iVar7 = pNtk->vPis->nSize;
  uVar17 = 0;
  uVar21 = 0;
  if (0 < (int)uVar14) {
    uVar21 = (ulong)uVar14;
  }
  iVar20 = 0;
  for (; uVar21 != uVar17; uVar17 = uVar17 + 1) {
    iVar20 = iVar20 + ppVVar4[uVar17]->nSize;
  }
  uVar19 = iVar7 + uVar14;
  local_40 = stats;
  piVar9 = zeros(iVar7 + uVar14 + 1);
  local_60 = ints(iVar20 * 2);
  *piVar9 = 0;
  psVar13 = (sim_result *)0x0;
  local_38 = CONCAT44(local_38._4_4_,uVar19);
  local_68 = (sim_result *)0x0;
  local_58 = s;
  if (0 < (int)uVar19) {
    local_68 = (sim_result *)(ulong)uVar19;
  }
  for (; s_00 = local_58, piVar5 = local_60, psVar13 != local_68;
      psVar13 = (sim_result *)((long)&psVar13->inVec + 1)) {
    lVar10 = (long)pNtk->vPos->nSize;
    iVar7 = piVar9[(long)psVar13];
    lVar28 = (long)iVar7;
    if ((long)psVar13 < lVar10) {
      iVar7 = ppVVar4[(long)psVar13]->nSize + iVar7;
      piVar9[(long)((long)&psVar13->inVec + 1)] = iVar7;
      for (lVar10 = 0; lVar28 + lVar10 < (long)iVar7; lVar10 = lVar10 + 1) {
        iVar7 = Vec_IntEntry(ppVVar4[(long)psVar13],(int)lVar10);
        piVar5[lVar28 + lVar10] = iVar7 + pNtk->vPos->nSize;
        iVar7 = piVar9[(long)((long)&psVar13->inVec + 1)];
      }
    }
    else {
      iVar7 = local_50[(int)psVar13 - lVar10]->nSize + iVar7;
      piVar9[(long)((long)&psVar13->inVec + 1)] = iVar7;
      for (lVar10 = 0; lVar28 + lVar10 < (long)iVar7; lVar10 = lVar10 + 1) {
        iVar7 = Vec_IntEntry(local_50[(long)(int)psVar13 - (long)pNtk->vPos->nSize],(int)lVar10);
        piVar5[lVar28 + lVar10] = iVar7;
        iVar7 = piVar9[(long)((long)&psVar13->inVec + 1)];
      }
    }
  }
  local_58->n = (int)local_38;
  local_58->depAdj = piVar9;
  local_58->depEdg = local_60;
  bVar30 = directed == 0;
  pcVar16 = is_directed_automorphism;
  if (bVar30) {
    pcVar16 = is_undirected_automorphism;
  }
  pcVar18 = ref_singleton_directed;
  if (bVar30) {
    pcVar18 = ref_singleton_undirected;
  }
  pcVar22 = ref_nonsingle_directed;
  if (bVar30) {
    pcVar22 = ref_nonsingle_undirected;
  }
  local_58->stats = local_40;
  local_58->is_automorphism = pcVar16;
  local_58->ref_singleton = pcVar18;
  local_58->ref_nonsingle = pcVar22;
  local_58->indmin = 0;
  local_58->lev = 1;
  local_58->anc = 1;
  local_58->ndiffnons = 0;
  local_58->nundiffs = 0;
  local_58->ndiffs = 0;
  local_58->activityInc = 1.0;
  iVar7 = (int)local_38;
  for (lVar10 = 0; lVar10 < iVar7; lVar10 = lVar10 + 1) {
    local_58->theta[lVar10] = (int)lVar10;
    iVar7 = local_58->n;
  }
  for (lVar10 = 0; lVar10 < iVar7; lVar10 = lVar10 + 1) {
    local_58->gamma[lVar10] = (int)lVar10;
    iVar7 = local_58->n;
  }
  for (lVar10 = 0; lVar10 < iVar7; lVar10 = lVar10 + 1) {
    local_58->thsize[lVar10] = 1;
    iVar7 = local_58->n;
  }
  for (lVar10 = 0; lVar10 < iVar7; lVar10 = lVar10 + 1) {
    local_58->thnext[lVar10] = (int)lVar10;
    local_58->thprev[lVar10] = (int)lVar10;
    iVar7 = local_58->n;
  }
  local_58->npairs = 0;
  for (lVar10 = 0; lVar10 < iVar7; lVar10 = lVar10 + 1) {
    local_58->unpairs[lVar10] = -1;
    iVar7 = local_58->n;
  }
  for (lVar10 = 0; lVar10 < iVar7; lVar10 = lVar10 + 1) {
    local_58->undiffnons[lVar10] = -1;
    iVar7 = local_58->n;
  }
  local_40->grpsize_base = 1.0;
  local_40->grpsize_exp = 0;
  auVar32 = ZEXT812(1);
  local_40->nodes = auVar32._0_4_;
  local_40->bads = auVar32._4_4_;
  local_40->gens = auVar32._8_4_;
  local_40->support = 0;
  local_58->nninduce = 0;
  local_58->nsinduce = 0;
  local_58->csize = 0;
  uVar14 = 0;
  for (lVar10 = 0; lVar10 < iVar7; lVar10 = lVar10 + 1) {
    local_58->ccount[colors[lVar10]] = local_58->ccount[colors[lVar10]] + 1;
    if ((int)uVar14 <= colors[lVar10]) {
      uVar14 = colors[lVar10];
    }
    iVar7 = local_58->n;
  }
  local_58->nsplits = uVar14 + 1;
  piVar9 = (local_58->left).clen;
  piVar5 = local_58->ccount;
  *piVar9 = *piVar5 + -1;
  uVar17 = 0;
  uVar21 = 0;
  if (0 < (int)uVar14) {
    uVar21 = (ulong)uVar14;
  }
  for (; uVar21 != uVar17; uVar17 = uVar17 + 1) {
    piVar9[piVar5[uVar17]] = piVar5[uVar17 + 1] + -1;
    piVar5[uVar17 + 1] = piVar5[uVar17 + 1] + piVar5[uVar17];
  }
  c = &local_58->left;
  for (lVar10 = 0; lVar10 < local_58->n; lVar10 = lVar10 + 1) {
    iVar7 = piVar5[colors[lVar10]];
    iVar20 = iVar7 + -1;
    piVar5[colors[lVar10]] = iVar20;
    (local_58->left).lab[(long)iVar7 + -1] = (int)lVar10;
    (local_58->left).unlab[lVar10] = iVar20;
  }
  for (uVar17 = 0; uVar17 <= uVar14; uVar17 = uVar17 + 1) {
    piVar5[uVar17] = 0;
  }
  for (iVar7 = 0; iVar20 = s_00->n, iVar7 < iVar20; iVar7 = iVar7 + piVar9[iVar7] + 1) {
    add_induce(s_00,c,iVar7);
    fix_fronts(c,iVar7,iVar7);
    piVar9 = (s_00->left).clen;
  }
  iVar7 = -1;
  for (iVar15 = 0; iVar15 < iVar20; iVar15 = iVar15 + iVar23 + 1) {
    if (piVar9[iVar15] == 0) {
      iVar23 = 0;
    }
    else {
      s_00->prevnon[iVar15] = iVar7;
      s_00->nextnon[iVar7] = iVar15;
      iVar23 = piVar9[iVar15];
      iVar20 = s_00->n;
      iVar7 = iVar15;
    }
  }
  s_00->prevnon[iVar20] = iVar7;
  s_00->nextnon[iVar7] = s_00->n;
  s_00->split = split_init;
  s_00->refineBySim1 = refineBySim1_init;
  s_00->refineBySim2 = refineBySim2_init;
  printf("Initial Refine by Dependency graph ... ");
  refineByDepGraph(s_00,c);
  puts("done!");
  printf("Initial Refine by Simulation ... ");
  puts("done!\n\t--------------------");
  s_00->refineBySim1 = refineBySim1_left;
  s_00->refineBySim2 = refineBySim2_left;
  do {
    iVar7 = s_00->n;
    if (s_00->nsplits == iVar7) {
      s_00->splitlev[s_00->lev] = s_00->nsplits;
      break;
    }
    iVar20 = s_00->pNtk->vPos->nSize;
    if (s_00->nextnon[-1] < iVar20) {
      iVar7 = iVar20;
      iVar20 = s_00->nextnon[-1];
    }
    iVar7 = select_smallest_max_connected_cell(s_00,iVar20,iVar7);
    if (s_00->fPrintTree != 0) {
      pcVar11 = getVertexName(s_00->pNtk,(s_00->left).lab[iVar7]);
      pcVar12 = getVertexName(s_00->pNtk,(s_00->left).lab[iVar7]);
      printf("%s->%s\n",pcVar11,pcVar12);
    }
    s_00->splitvar[s_00->lev] = (s_00->left).lab[iVar7];
    s_00->start[s_00->lev] = iVar7;
    s_00->splitlev[s_00->lev] = s_00->nsplits;
    iVar7 = descend(s_00,c,iVar7,iVar7);
  } while (iVar7 != 0);
  s_00->split = split_other;
  s_00->refineBySim1 = refineBySim1_other;
  s_00->refineBySim2 = refineBySim2_other;
  s_00->anc = s_00->lev;
  s_00->stats->levels = s_00->lev;
  c_00 = &s_00->right;
  memcpy((s_00->right).lab,(s_00->left).lab,(long)s_00->n << 2);
  memcpy((s_00->right).unlab,(s_00->left).unlab,(long)s_00->n << 2);
  memcpy((s_00->right).clen,(s_00->left).clen,(long)s_00->n << 2);
  memcpy((s_00->right).cfront,(s_00->left).cfront,(long)s_00->n << 2);
  memcpy(s_00->threp,(s_00->left).lab,(long)s_00->n << 2);
  memcpy(s_00->thfront,(s_00->left).unlab,(long)s_00->n << 2);
  s_00->select_decomposition = select_statically;
  do {
    unprepare_permutation(s_00);
    if (s_00->anc < s_00->lev) {
      s_00->lev = s_00->anc + 1;
    }
    iVar7 = s_00->nsplits;
    iVar15 = backtrack_loop(s_00);
    iVar20 = s_00->nsplits;
    s_00->nsplits = iVar7;
    rewind_coloring(s_00,c,s_00->lev + 1);
    s_00->nsplits = iVar20;
    if ((s_00->fBooleanMatching != 0) &&
       ((1.0 < s_00->stats->grpsize_base || (0 < s_00->stats->grpsize_exp)))) {
      return;
    }
    if ((s_00->fPrintTree != 0) && (uVar14 = s_00->lev, 0 < (int)uVar14)) goto LAB_00271b16;
LAB_002715fc:
    if ((long)s_00->lev == 0) {
      psVar6 = s_00->stats;
      dVar31 = psVar6->grpsize_base;
      while (10.0 <= dVar31) {
        dVar31 = dVar31 / 10.0;
        psVar6->grpsize_base = dVar31;
        psVar6->grpsize_exp = psVar6->grpsize_exp + 1;
      }
      return;
    }
    iVar7 = s_00->start[s_00->lev];
    while( true ) {
      iVar7 = descend(s_00,c_00,iVar7,iVar15);
      if ((iVar7 == 0) || (s_00->nsplits != s_00->splitlev[s_00->lev])) goto LAB_002717d9;
      if (s_00->nsplits == s_00->n) break;
      (*s_00->select_decomposition)(s_00,&target,&lmin,&rmin);
      if (s_00->fPrintTree != 0) {
        uVar14 = s_00->lev;
        pcVar11 = getVertexName(s_00->pNtk,(s_00->left).lab[lmin]);
        pcVar12 = getVertexName(s_00->pNtk,(s_00->right).lab[rmin]);
        printf("in level %d: %s->%s\n",(ulong)uVar14,pcVar11,pcVar12);
      }
      s_00->match = 0;
      s_00->start[s_00->lev] = target;
      s_00->split = split_left;
      descend(s_00,c,target,lmin);
      piVar9 = s_00->splitlev;
      piVar9[s_00->lev] = s_00->nsplits;
      s_00->split = split_other;
      iVar7 = s_00->lev;
      s_00->lev = iVar7 + -1;
      s_00->nsplits = piVar9[(long)iVar7 + -1];
      s_00->specmin[(long)iVar7 + -1] = (s_00->right).lab[rmin];
      iVar7 = target;
      iVar15 = rmin;
    }
    for (lVar10 = 0; lVar10 < s_00->ndiffs; lVar10 = lVar10 + 1) {
      iVar7 = (s_00->right).unlab[s_00->diffs[lVar10]];
      iVar20 = (s_00->left).lab[iVar7];
      s_00->unsupp[lVar10] = iVar20;
      s_00->gamma[iVar20] = (s_00->right).lab[iVar7];
    }
    prepare_permutation_ntk(s_00);
    iVar7 = (*s_00->is_automorphism)(s_00);
    if (iVar7 == 0) {
      unprepare_permutation(s_00);
LAB_002717d9:
      piVar9 = &s_00->stats->bads;
      *piVar9 = *piVar9 + 1;
      local_38 = (long)s_00->lev;
      iVar7 = backtrack_loop(s_00);
      uVar14 = s_00->lev;
      uVar19 = uVar14;
LAB_00271802:
      local_40 = (saucy_stats *)CONCAT44(local_40._4_4_,iVar7);
      p = s_00->satCounterExamples;
      n = p->nSize;
      uVar17 = (ulong)n;
      piVar9 = zeros(n);
      if (n != 0) {
        iVar7 = 0;
        while (iVar7 < (int)uVar17) {
          local_50 = (Vec_Int_t **)CONCAT44(local_50._4_4_,iVar7);
          psVar13 = (sim_result *)Vec_PtrEntry(p,iVar7);
          lVar10 = 0;
          while( true ) {
            p = s_00->satCounterExamples;
            uVar17 = (ulong)p->nSize;
            if ((long)uVar17 <= lVar10) break;
            if (piVar9[lVar10] == 0) {
              local_68 = (sim_result *)Vec_PtrEntry(p,(int)lVar10);
              s_00 = local_58;
              iVar7 = local_58->pNtk->vPos->nSize;
              lVar28 = (long)iVar7;
              local_60 = (int *)CONCAT44(local_60._4_4_,iVar7);
              for (iVar20 = iVar7; iVar20 < local_58->pNtk->vPis->nSize + iVar7;
                  iVar20 = iVar20 + iVar23 + 1) {
                piVar5 = (local_58->left).lab;
                lVar27 = (long)iVar20;
                iVar15 = psVar13->inVec[piVar5[lVar27] - lVar28];
                iVar23 = (local_58->right).clen[lVar27];
                lVar29 = lVar27 + 1;
                lVar26 = (long)(iVar23 + iVar20);
                lVar25 = lVar29;
                while (lVar25 <= lVar26) {
                  piVar1 = piVar5 + lVar25;
                  lVar25 = lVar25 + 1;
                  if (iVar15 != psVar13->inVec[*piVar1 - lVar28]) {
                    p = local_58->satCounterExamples;
                    uVar17 = (ulong)(uint)p->nSize;
                    goto LAB_002719f1;
                  }
                }
                iVar24 = local_68->inVec[c_00->lab[lVar27] - lVar28];
                while (lVar29 <= lVar26) {
                  piVar5 = c_00->lab + lVar29;
                  lVar29 = lVar29 + 1;
                  if (iVar24 != local_68->inVec[*piVar5 - lVar28]) goto LAB_0027185e;
                }
                if (iVar15 != iVar24) goto LAB_0027185e;
              }
              if (psVar13->outVecOnes != local_68->outVecOnes) {
                bumpActivity(local_58,psVar13);
                bumpActivity(s_00,local_68);
LAB_00271a1b:
                free(piVar9);
                iVar7 = backtrack_loop(s_00);
                uVar19 = s_00->lev;
                if (uVar19 != 0) goto LAB_00271802;
                iVar15 = -1;
                if (s_00->fPrintTree == 0) goto LAB_002715fc;
                printf("Backtrack by SAT from level %d to %d\n",(ulong)uVar14,0);
                iVar15 = -1;
                goto LAB_00271ae6;
              }
              if (iVar7 != 1) {
                for (iVar20 = 0; iVar20 < iVar7; iVar20 = iVar20 + iVar15 + 1) {
                  lVar28 = (long)iVar20;
                  iVar15 = (local_58->right).clen[lVar28];
                  iVar23 = 0;
                  iVar24 = 0;
                  for (; lVar28 <= iVar15 + iVar20; lVar28 = lVar28 + 1) {
                    iVar23 = (iVar23 + 1) - (uint)(psVar13->outVec[c->lab[lVar28]] == 0);
                    iVar24 = (iVar24 + 1) - (uint)(local_68->outVec[c_00->lab[lVar28]] == 0);
                  }
                  if (iVar23 != iVar24) {
                    bumpActivity(local_58,psVar13);
                    bumpActivity(s_00,local_68);
                    goto LAB_00271a1b;
                  }
                }
              }
            }
LAB_0027185e:
            lVar10 = lVar10 + 1;
            s_00 = local_58;
          }
LAB_002719f1:
          iVar7 = (int)local_50 + 1;
        }
        free(piVar9);
        uVar19 = s_00->lev;
      }
      iVar15 = (int)local_40;
      if ((s_00->fPrintTree != 0) && ((int)uVar19 < (int)uVar14)) {
        printf("Backtrack by SAT from level %d to %d\n",(ulong)uVar14,(ulong)uVar19);
        uVar19 = s_00->lev;
      }
      iVar7 = s_00->nsplits;
      s_00->nsplits = s_00->splitlev[local_38];
      rewind_coloring(s_00,c,uVar19 + 1);
      s_00->nsplits = iVar7;
LAB_00271ae6:
      if (s_00->fPrintTree != 0) {
        puts("BAD NODE");
        uVar14 = s_00->lev;
        if (0 < (int)uVar14) {
          iVar20 = s_00->nsplits;
LAB_00271b16:
          pcVar11 = getVertexName(s_00->pNtk,(s_00->left).lab[s_00->splitwho[iVar20]]);
          pcVar12 = getVertexName(s_00->pNtk,(s_00->right).lab[iVar15]);
          printf("in level %d: %s->%s\n",(ulong)uVar14,pcVar11,pcVar12);
        }
      }
      goto LAB_002715fc;
    }
    psVar6 = s_00->stats;
    iVar7 = s_00->ndiffs;
    uVar2 = psVar6->gens;
    uVar3 = psVar6->support;
    psVar6->gens = uVar2 + 1;
    psVar6->support = iVar7 + uVar3;
    for (lVar10 = 0; lVar10 < iVar7; lVar10 = lVar10 + 1) {
      iVar7 = s_00->unsupp[lVar10];
      iVar20 = find_representative(iVar7,s_00->theta);
      iVar7 = find_representative(s_00->gamma[iVar7],s_00->theta);
      if (iVar20 != iVar7) {
        iVar15 = iVar7;
        if (iVar20 < iVar7) {
          iVar15 = iVar20;
        }
        if (iVar7 < iVar20) {
          iVar7 = iVar20;
        }
        s_00->theta[iVar7] = iVar15;
        piVar9 = s_00->thsize + iVar15;
        *piVar9 = *piVar9 + s_00->thsize[iVar7];
        piVar9 = s_00->thnext;
        piVar5 = s_00->thprev;
        iVar20 = piVar9[iVar7];
        piVar9[piVar5[iVar7]] = iVar20;
        piVar5[iVar20] = piVar5[iVar7];
        s_00->threp[s_00->thfront[iVar7]] = piVar9[iVar7];
      }
      iVar7 = s_00->ndiffs;
    }
    (*s_00->print_automorphism)
              (s_00->gFile,s_00->n,s_00->gamma,iVar7,s_00->unsupp,s_00->marks,s_00->pNtk);
    unprepare_permutation(s_00);
  } while( true );
}

Assistant:

void
saucy_search(
    Abc_Ntk_t * pNtk,
    struct saucy *s,
    int directed,
    const int *colors,
    struct saucy_stats *stats)
{
    int i, j, max = 0;  
    struct saucy_graph *g;

    extern Abc_Ntk_t * Abc_NtkDup( Abc_Ntk_t * pNtk );

    /* Save network information */
    s->pNtk = pNtk;
    s->pNtk_permuted = Abc_NtkDup( pNtk );  

    /* Builde dependency graph */
    g = buildDepGraph(pNtk, s->iDep, s->oDep);  

    /* Save graph information */
    s->n = g->n;
    s->depAdj = g->adj;
    s->depEdg = g->edg;
    /*s->dadj = g->adj + g->n + 1;
    s->dedg = g->edg + g->e;*/

    /* Save client information */
    s->stats = stats;       

    /* Polymorphism */
    if (directed) {
        s->is_automorphism = is_directed_automorphism;
        s->ref_singleton = ref_singleton_directed;
        s->ref_nonsingle = ref_nonsingle_directed;
    }
    else {
        s->is_automorphism = is_undirected_automorphism;
        s->ref_singleton = ref_singleton_undirected;
        s->ref_nonsingle = ref_nonsingle_undirected;
    }

    /* Initialize scalars */
    s->indmin = 0;  
    s->lev = s->anc = 1;
    s->ndiffs = s->nundiffs = s->ndiffnons = 0;
    s->activityInc = 1;

    /* The initial orbit partition is discrete */
    for (i = 0; i < s->n; ++i) {
        s->theta[i] = i;
    }

    /* The initial permutation is the identity */
    for (i = 0; i < s->n; ++i) {
        s->gamma[i] = i;
    }

    /* Initially every cell of theta has one element */
    for (i = 0; i < s->n; ++i) {
        s->thsize[i] = 1;
    }

    /* Every theta rep list is singleton */
    for (i = 0; i < s->n; ++i) {
        s->thprev[i] = s->thnext[i] = i;
    }

    /* We have no pairs yet */
    s->npairs = 0;
    for (i = 0; i < s->n; ++i) {
        s->unpairs[i] = -1;
    }

    /* Ensure no stray pointers in undiffnons, which is checked by removed_diffnon() */
    for (i = 0; i < s->n; ++i) {
        s->undiffnons[i] = -1;
    }

    /* Initialize stats */
    s->stats->grpsize_base = 1.0;
    s->stats->grpsize_exp = 0;
    s->stats->nodes = 1;
    s->stats->bads = s->stats->gens = s->stats->support = 0;

    /* Prepare for refinement */
    s->nninduce = s->nsinduce = 0;
    s->csize = 0;

    /* Count cell sizes */
    for (i = 0; i < s->n; ++i) {
        s->ccount[colors[i]]++;
        if (max < colors[i]) max = colors[i];
    }
    s->nsplits = max + 1;

    /* Build cell lengths */
    s->left.clen[0] = s->ccount[0] - 1;
    for (i = 0; i < max; ++i) {
        s->left.clen[s->ccount[i]] = s->ccount[i+1] - 1;
        s->ccount[i+1] += s->ccount[i];
    }

    /* Build the label array */
    for (i = 0; i < s->n; ++i) {
        set_label(&s->left, --s->ccount[colors[i]], i);
    }

    /* Clear out ccount */
    for (i = 0; i <= max; ++i) {
        s->ccount[i] = 0;
    }

    /* Update refinement stuff based on initial partition */
    for (i = 0; i < s->n; i += s->left.clen[i]+1) {
        add_induce(s, &s->left, i);
        fix_fronts(&s->left, i, i);
    }

    /* Prepare lists based on cell lengths */
    for (i = 0, j = -1; i < s->n; i += s->left.clen[i] + 1) {
        if (!s->left.clen[i]) continue;
        s->prevnon[i] = j;
        s->nextnon[j] = i;
        j = i;
    }

    /* Fix the end */
    s->prevnon[s->n] = j;
    s->nextnon[j] = s->n;

    /* Preprocessing after initial coloring */
    s->split = split_init;  
    s->refineBySim1 = refineBySim1_init;
    s->refineBySim2 = refineBySim2_init;    

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("Initial Refine by Dependency graph ... ");
    refineByDepGraph(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("done!\n");
    
    printf("Initial Refine by Simulation ... ");
    if (REFINE_BY_SIM_1) s->refineBySim1(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_2) s->refineBySim2(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("done!\n\t--------------------\n");

    /* Descend along the leftmost branch and compute zeta */
    s->refineBySim1 = refineBySim1_left;
    s->refineBySim2 = refineBySim2_left;
    descend_leftmost(s);    
    s->split = split_other; 
    s->refineBySim1 = refineBySim1_other;
    s->refineBySim2 = refineBySim2_other;   

    /* Our common ancestor with zeta is the current level */
    s->stats->levels = s->anc = s->lev;

    /* Copy over this data to our non-leftmost coloring */
    memcpy(s->right.lab, s->left.lab, s->n * sizeof(int));
    memcpy(s->right.unlab, s->left.unlab, s->n * sizeof(int));
    memcpy(s->right.clen, s->left.clen, s->n * sizeof(int));
    memcpy(s->right.cfront, s->left.cfront, s->n * sizeof(int));

    /* The reps are just the labels at this point */
    memcpy(s->threp, s->left.lab, s->n * sizeof(int));
    memcpy(s->thfront, s->left.unlab, s->n * sizeof(int));

    /* choose cell selection method */
    if (SELECT_DYNAMICALLY) s->select_decomposition = select_dynamically;
    else                    s->select_decomposition = select_statically;

    /* Keep running till we're out of automorphisms */
    while (do_search(s));
}